

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::updateContentsRect(QWidgetPrivate *this)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QSize local_58;
  QSize local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if (this->layout == (QLayout *)0x0) {
    QWidget::updateGeometry(this_00);
  }
  else {
    QLayout::update(this->layout);
  }
  if ((this_00->data->widget_attributes & 0x8000) == 0) {
    QWidget::setAttribute(this_00,WA_PendingResizeEvent,true);
  }
  else {
    QWidget::update(this_00);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = QRect::size(&this_00->data->crect);
    local_58 = QRect::size(&this_00->data->crect);
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_48,&local_50,&local_58);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_48);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,ContentsRectChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::updateContentsRect()
{
    Q_Q(QWidget);

    if (layout)
        layout->update(); //force activate; will do updateGeometry
    else
        q->updateGeometry();

    if (q->isVisible()) {
        q->update();
        QResizeEvent e(q->data->crect.size(), q->data->crect.size());
        QCoreApplication::sendEvent(q, &e);
    } else {
        q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

    QEvent e(QEvent::ContentsRectChange);
    QCoreApplication::sendEvent(q, &e);
}